

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::Split
          (ON_NurbsSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  double *pdVar1;
  double *__src;
  void *__dest;
  bool bVar2;
  int iVar3;
  ON_NurbsCurve *pOVar4;
  int iVar5;
  ON_Curve *local_138;
  ON_Curve *right_side;
  ON_Curve *left_side;
  undefined1 local_118 [8];
  ON_NurbsCurve right_crv;
  ON_NurbsCurve left_crv;
  ON_NurbsCurve crv;
  ON_NurbsSurface *right_srf;
  ON_NurbsSurface *left_srf;
  ON_Surface **local_38;
  ON_Surface **east_or_north_side_local;
  ON_Surface **west_or_south_side_local;
  double c_local;
  ON_NurbsSurface *pOStack_18;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = 0;
  }
  else {
    local_38 = east_or_north_side;
    east_or_north_side_local = west_or_south_side;
    west_or_south_side_local = (ON_Surface **)c;
    c_local._4_4_ = dir;
    pOStack_18 = this;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)(uint)dir);
    bVar2 = ON_Interval::Includes((ON_Interval *)&left_srf,(double)west_or_south_side_local,true);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      right_srf = (ON_NurbsSurface *)0x0;
      crv.m_cv = (double *)0x0;
      if (*east_or_north_side_local != (ON_Surface *)0x0) {
        right_srf = Cast((ON_Object *)*east_or_north_side_local);
        if (right_srf == (ON_NurbsSurface *)0x0) {
          this_local._7_1_ = 0;
          goto LAB_0078732f;
        }
        ON_Surface::DestroySurfaceTree(&right_srf->super_ON_Surface);
      }
      if (*local_38 != (ON_Surface *)0x0) {
        crv.m_cv = (double *)Cast((ON_Object *)*local_38);
        if ((ON_NurbsSurface *)crv.m_cv == (ON_NurbsSurface *)0x0) {
          this_local._7_1_ = 0;
          goto LAB_0078732f;
        }
        ON_Surface::DestroySurfaceTree((ON_Surface *)crv.m_cv);
      }
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)&left_crv.m_cv);
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)&right_crv.m_cv);
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_118);
      pOVar4 = ToCurve(this,c_local._4_4_,(ON_NurbsCurve *)&left_crv.m_cv);
      if (pOVar4 == (ON_NurbsCurve *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        right_side = (ON_Curve *)&right_crv.m_cv;
        local_138 = (ON_Curve *)local_118;
        bVar2 = ON_NurbsCurve::Split
                          ((ON_NurbsCurve *)&left_crv.m_cv,(double)west_or_south_side_local,
                           &right_side,&local_138);
        if (bVar2) {
          if (right_srf == (ON_NurbsSurface *)0x0) {
            right_srf = (ON_NurbsSurface *)operator_new(0x58);
            ON_NurbsSurface(right_srf);
          }
          if (right_srf != this) {
            right_srf->m_dim = this->m_dim;
            right_srf->m_is_rat = this->m_is_rat;
            right_srf->m_order[1 - c_local._4_4_] = this->m_order[1 - c_local._4_4_];
            right_srf->m_cv_count[1 - c_local._4_4_] = this->m_cv_count[1 - c_local._4_4_];
            iVar5 = 1 - c_local._4_4_;
            iVar3 = KnotCount(this,iVar5);
            ReserveKnotCapacity(right_srf,iVar5,iVar3);
            iVar3 = 1 - c_local._4_4_;
            pdVar1 = right_srf->m_knot[iVar3];
            __src = this->m_knot[iVar3];
            iVar3 = KnotCount(this,iVar3);
            memcpy(pdVar1,__src,(long)iVar3 << 3);
          }
          bVar2 = FromCurve((ON_NurbsCurve *)&right_crv.m_cv,right_srf,c_local._4_4_);
          if (bVar2) {
            if (crv.m_cv == (double *)0x0) {
              crv.m_cv = (double *)operator_new(0x58);
              ON_NurbsSurface((ON_NurbsSurface *)crv.m_cv);
            }
            if ((ON_NurbsSurface *)crv.m_cv != this) {
              *(int *)(crv.m_cv + 2) = this->m_dim;
              *(int *)((long)crv.m_cv + 0x14) = this->m_is_rat;
              *(int *)((long)crv.m_cv + (long)(1 - c_local._4_4_) * 4 + 0x18) =
                   this->m_order[1 - c_local._4_4_];
              *(int *)((long)crv.m_cv + (long)(1 - c_local._4_4_) * 4 + 0x20) =
                   this->m_cv_count[1 - c_local._4_4_];
              iVar5 = 1 - c_local._4_4_;
              iVar3 = KnotCount(this,iVar5);
              ReserveKnotCapacity((ON_NurbsSurface *)crv.m_cv,iVar5,iVar3);
              iVar3 = 1 - c_local._4_4_;
              __dest = (void *)crv.m_cv[(long)iVar3 + 6];
              pdVar1 = this->m_knot[iVar3];
              iVar3 = KnotCount(this,iVar3);
              memcpy(__dest,pdVar1,(long)iVar3 << 3);
            }
            bVar2 = FromCurve((ON_NurbsCurve *)local_118,(ON_NurbsSurface *)crv.m_cv,c_local._4_4_);
            if (bVar2) {
              if (*east_or_north_side_local == (ON_Surface *)0x0) {
                *east_or_north_side_local = &right_srf->super_ON_Surface;
              }
              if (*local_38 == (ON_Surface *)0x0) {
                *local_38 = (ON_Surface *)crv.m_cv;
              }
              this_local._7_1_ = 1;
            }
            else {
              if ((right_srf == this) || (right_srf == (ON_NurbsSurface *)*east_or_north_side_local)
                 ) {
                Destroy(right_srf);
              }
              else if (right_srf != (ON_NurbsSurface *)0x0) {
                (*(right_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4]
                )();
              }
              if (((ON_NurbsSurface *)crv.m_cv == this) || ((ON_Surface *)crv.m_cv == *local_38)) {
                Destroy((ON_NurbsSurface *)crv.m_cv);
              }
              else if (crv.m_cv != (double *)0x0) {
                (**(code **)((long)*crv.m_cv + 0x20))();
              }
              this_local._7_1_ = 0;
            }
          }
          else {
            if ((right_srf == this) || (right_srf == (ON_NurbsSurface *)*east_or_north_side_local))
            {
              Destroy(right_srf);
            }
            else if (right_srf != (ON_NurbsSurface *)0x0) {
              (*(right_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                        ();
            }
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      left_side._0_4_ = 1;
      ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_118);
      ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)&right_crv.m_cv);
      ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)&left_crv.m_cv);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_0078732f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_NurbsSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes( c, true ) )
    return false;
  ON_NurbsSurface* left_srf = 0;
  ON_NurbsSurface* right_srf = 0;

  if ( west_or_south_side )
  {
    left_srf = ON_NurbsSurface::Cast( west_or_south_side );
    if ( !left_srf )
      return false;
    left_srf->DestroySurfaceTree();
  }

  if ( east_or_north_side )
  {
    right_srf = ON_NurbsSurface::Cast( east_or_north_side );
    if ( !right_srf )
      return false;
    right_srf->DestroySurfaceTree();
  }

  ON_NurbsCurve crv, left_crv, right_crv;
  if ( !ToCurve( *this, dir, &crv ) )
    return false;
  ON_Curve *left_side, *right_side;
  left_side = &left_crv;
  right_side = &right_crv;
  if ( !crv.Split( c, left_side, right_side ) )
    return false;
  
  if ( !left_srf )
    left_srf = new ON_NurbsSurface();

  if ( left_srf != this )
  {
    left_srf->m_dim = m_dim;
    left_srf->m_is_rat = m_is_rat;
    left_srf->m_order[1-dir] = m_order[1-dir];
    left_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    left_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( left_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( left_crv, *left_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    return false;
  }

  if ( !right_srf )
    right_srf = new ON_NurbsSurface();

  if ( right_srf != this )
  {
    right_srf->m_dim = m_dim;
    right_srf->m_is_rat = m_is_rat;
    right_srf->m_order[1-dir] = m_order[1-dir];
    right_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    right_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( right_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( right_crv, *right_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    if ( right_srf != this && right_srf !=  east_or_north_side )
      delete right_srf;
    else
      right_srf->Destroy();

    return false;
  }

  if ( !west_or_south_side)
    west_or_south_side = left_srf;

  if ( !east_or_north_side)
    east_or_north_side = right_srf;

  return true;  
}